

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFNMatrix<3,_Fad<long_double>_>::TPZFNMatrix
          (TPZFNMatrix<3,_Fad<long_double>_> *this,TPZFNMatrix<3,_Fad<long_double>_> *copy)

{
  TPZRegisterClassId *in_RDI;
  int64_t in_stack_00000008;
  Fad<long_double> *in_stack_00000010;
  int64_t in_stack_00000018;
  int64_t in_stack_00000020;
  void **in_stack_00000028;
  TPZFMatrix<Fad<long_double>_> *in_stack_00000030;
  TPZFNMatrix<3,_Fad<long_double>_> *in_stack_ffffffffffffff88;
  TPZFNMatrix<3,_Fad<long_double>_> *in_stack_ffffffffffffff90;
  Fad<long_double> *in_stack_ffffffffffffffa0;
  TPZRegisterClassId *local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFNMatrix<3,Fad<long_double>>>(in_RDI,0x21);
  *(undefined ***)in_RDI = &PTR__TPZFNMatrix_02413498;
  TPZFMatrix<Fad<long_double>_>::TPZFMatrix
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000010,in_stack_00000008);
  *(undefined ***)in_RDI = &PTR__TPZFNMatrix_02413498;
  local_38 = in_RDI + 0x90;
  do {
    Fad<long_double>::Fad(in_stack_ffffffffffffffa0);
    local_38 = local_38 + 0x30;
  } while (local_38 != in_RDI + 0x150);
  operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

inline TPZFNMatrix(const TPZFNMatrix<N,TVar> &copy) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(0,0,fBuf,N)
    {
        *this = copy;
    }